

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Clock.cxx
# Opt level: O1

void __thiscall Fl_Clock_Output::draw(Fl_Clock_Output *this,int X,int Y,int W,int H)

{
  Fl_Color fill;
  int iVar1;
  Fl_Color FVar2;
  ulong uVar3;
  int i;
  int iVar4;
  double x;
  double y;
  double w;
  double h;
  
  FVar2 = 0x31;
  if ((this->super_Fl_Widget).type_ != '\x01') {
    FVar2 = (this->super_Fl_Widget).color_;
  }
  fill = fl_color_average(FVar2,0x38,0.5);
  Fl_Widget::draw_box(&this->super_Fl_Widget,(uint)(this->super_Fl_Widget).box_,X,Y,W,H,FVar2);
  Fl_Graphics_Driver::push_matrix(fl_graphics_driver);
  Fl_Graphics_Driver::mult_matrix
            (fl_graphics_driver,1.0,0.0,0.0,1.0,(double)W * 0.5 + (double)X + -0.5,
             (double)H * 0.5 + (double)Y + -0.5);
  Fl_Graphics_Driver::mult_matrix
            (fl_graphics_driver,(double)(W + -1) / 28.0,0.0,0.0,(double)(H + -1) / 28.0,0.0,0.0);
  if ((this->super_Fl_Widget).type_ == '\x01') {
    iVar1 = Fl_Widget::active_r(&this->super_Fl_Widget);
    FVar2 = (this->super_Fl_Widget).color_;
    if (iVar1 == 0) {
      FVar2 = fl_inactive(FVar2);
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar2);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1b])();
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1e])(0,0,0x402c000000000000);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x25])();
    iVar1 = Fl_Widget::active_r(&this->super_Fl_Widget);
    uVar3 = 0;
    if (iVar1 == 0) {
      FVar2 = fl_inactive(0);
      uVar3 = (ulong)FVar2;
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,uVar3);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1a])();
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1e])(0);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x24])();
  }
  Fl_Graphics_Driver::push_matrix(fl_graphics_driver);
  Fl_Graphics_Driver::mult_matrix(fl_graphics_driver,1.0,0.0,0.0,1.0,0.6,0.6);
  drawhands(this,fill,fill);
  Fl_Graphics_Driver::pop_matrix(fl_graphics_driver);
  Fl_Graphics_Driver::push_matrix(fl_graphics_driver);
  iVar1 = Fl_Widget::active_r(&this->super_Fl_Widget);
  iVar4 = 0;
  uVar3 = 0;
  if (iVar1 == 0) {
    FVar2 = fl_inactive(0);
    uVar3 = (ulong)FVar2;
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,uVar3);
  do {
    switch(iVar4) {
    case 0:
    case 3:
    case 9:
      x = -0.5;
      y = 9.5;
      w = 1.0;
      h = 1.0;
      break;
    default:
      x = -0.25;
      y = 9.5;
      w = 0.5;
      h = 1.0;
      break;
    case 6:
      x = -0.5;
      y = 9.0;
      w = 1.0;
      h = 2.0;
    }
    rect(x,y,w,h);
    Fl_Graphics_Driver::rotate(fl_graphics_driver,-30.0);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0xc);
  Fl_Graphics_Driver::pop_matrix(fl_graphics_driver);
  drawhands(this,(this->super_Fl_Widget).color2_,0);
  Fl_Graphics_Driver::pop_matrix(fl_graphics_driver);
  return;
}

Assistant:

void Fl_Clock_Output::draw(int X, int Y, int W, int H) {
  Fl_Color box_color = type()==FL_ROUND_CLOCK ? FL_GRAY : color();
  Fl_Color shadow_color = fl_color_average(box_color, FL_BLACK, 0.5);
  draw_box(box(), X, Y, W, H, box_color);
  fl_push_matrix();
  fl_translate(X+W/2.0-.5, Y+H/2.0-.5);
  fl_scale((W-1)/28.0, (H-1)/28.0);
  if (type() == FL_ROUND_CLOCK) {
    fl_color(active_r() ? color() : fl_inactive(color()));
    fl_begin_polygon(); fl_circle(0,0,14); fl_end_polygon();
    fl_color(active_r() ? FL_FOREGROUND_COLOR : fl_inactive(FL_FOREGROUND_COLOR));
    fl_begin_loop(); fl_circle(0,0,14); fl_end_loop();
  }
  // draw the shadows:
  fl_push_matrix();
  fl_translate(0.60, 0.60);
  drawhands(shadow_color, shadow_color);
  fl_pop_matrix();
  // draw the tick marks:
  fl_push_matrix();
  fl_color(active_r() ? FL_FOREGROUND_COLOR : fl_inactive(FL_FOREGROUND_COLOR));
  for (int i=0; i<12; i++) {
    if (i==6) rect(-0.5, 9, 1, 2);
    else if (i==3 || i==0 || i== 9) rect(-0.5, 9.5, 1, 1);
    else rect(-0.25, 9.5, .5, 1);
    fl_rotate(-30);
  }
  fl_pop_matrix();
  // draw the hands:
  drawhands(selection_color(), FL_FOREGROUND_COLOR); // color was 54
  fl_pop_matrix();
}